

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O0

vector<candidate_variant,_std::allocator<candidate_variant>_> *
find_variants(vector<t_GSA,_std::allocator<t_GSA>_> *gsa_cluster)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference puVar8;
  vector<candidate_variant,_std::allocator<candidate_variant>_> *pvVar9;
  vector<t_GSA,_std::allocator<t_GSA>_> *in_RSI;
  vector<candidate_variant,_std::allocator<candidate_variant>_> *in_RDI;
  uint64_t lcp;
  uchar ch;
  uint64_t prefix_len;
  bool sample_1;
  value_type e_1;
  uint64_t i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_idx_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_pos_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_idx_0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_pos_0;
  uchar c1;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  uchar c0;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> all_chars;
  int c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> frequent_char_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> frequent_char_0;
  bool sample;
  value_type e;
  uint64_t i;
  uint64_t max_lcp_read_pos;
  uint64_t max_lcp_read_idx;
  uint64_t max_lcp_val;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  counts;
  vector<candidate_variant,_std::allocator<candidate_variant>_> *out;
  value_type *in_stack_fffffffffffffc78;
  candidate_variant *in_stack_fffffffffffffc80;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffc88;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffca0;
  const_iterator __last;
  const_iterator in_stack_fffffffffffffca8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffcc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffcc8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffcd0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_00;
  const_iterator in_stack_fffffffffffffcd8;
  undefined1 local_2c8 [72];
  pointer local_280;
  pointer local_278;
  pointer local_270;
  ulong local_268;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  uchar local_241;
  ulong local_240;
  byte local_231;
  undefined8 local_230;
  undefined8 local_228;
  vector<candidate_variant,_std::allocator<candidate_variant>_> *local_220;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_218 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e8 [2];
  uchar local_1b1;
  uchar *local_1b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1a0;
  uchar local_191;
  uchar *local_190;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_188;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_180;
  uchar *local_178;
  uchar *local_170;
  uchar *local_160;
  uchar *local_158;
  uchar *local_150;
  uchar *local_140;
  uchar *local_138;
  uchar *local_130;
  uchar *local_128;
  uchar *local_120;
  uchar *local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  uchar *local_f0;
  uchar *local_e8;
  uchar *local_e0;
  uchar *local_d8;
  uchar local_ce;
  uchar local_cd;
  int local_cc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  undefined4 local_98;
  undefined1 local_91;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  pointer local_78;
  pointer local_70;
  ulong local_68;
  undefined4 local_4c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_30;
  byte local_11;
  vector<t_GSA,_std::allocator<t_GSA>_> *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::vector<candidate_variant,_std::allocator<candidate_variant>_>::vector
            ((vector<candidate_variant,_std::allocator<candidate_variant>_> *)0x11b007);
  local_4c = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x11b027);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffca0,
             CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
             (value_type_conflict3 *)in_stack_fffffffffffffc90._M_current,
             (allocator_type *)in_stack_fffffffffffffc88._M_current);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x11b060);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(in_stack_fffffffffffffca0,CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
           (value_type *)in_stack_fffffffffffffc90._M_current,
           (allocator_type *)in_stack_fffffffffffffc88._M_current);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x11b091);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffc90._M_current);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x11b0ab);
  local_68 = 0;
  local_70 = (pointer)0x0;
  local_78 = (pointer)0x0;
  for (local_80 = 0; uVar1 = local_80,
      sVar4 = std::vector<t_GSA,_std::allocator<t_GSA>_>::size(local_10), uVar1 < sVar4;
      local_80 = local_80 + 1) {
    pvVar5 = std::vector<t_GSA,_std::allocator<t_GSA>_>::operator[](local_10,local_80);
    local_90._0_4_ = pvVar5->text;
    local_90._4_4_ = pvVar5->suff;
    local_88._0_4_ = pvVar5->lcp;
    local_88._4_1_ = pvVar5->bwt;
    local_88._5_3_ = *(undefined3 *)&pvVar5->field_0xd;
    if (local_68 < (local_88 & 0xffffffff)) {
      local_68 = local_88 & 0xffffffff;
      local_70 = (pointer)(local_90 & 0xffffffff);
      local_78 = (pointer)(local_90 >> 0x20);
    }
    local_91 = nr_reads1 <= (local_90 & 0xffffffff);
    pvVar6 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&local_30,(long)(int)(uint)(byte)local_91);
    iVar3 = base_to_int((uchar)((ulong)in_stack_fffffffffffffc80 >> 0x18));
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (pvVar6,(long)iVar3);
    *pvVar7 = *pvVar7 + 1;
  }
  if (local_68 < (ulong)(long)k_right) {
    local_11 = 1;
    local_98 = 1;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11b29a);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11b2a7);
    for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&local_30,0);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar6,(long)local_cc);
      if ((uint)mcov_out <= *pvVar7) {
        local_cd = int_to_base(local_cc);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffc80,(value_type_conflict4 *)in_stack_fffffffffffffc78);
      }
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&local_30,1);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar6,(long)local_cc);
      if ((uint)mcov_out <= *pvVar7) {
        local_ce = int_to_base(local_cc);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffc80,(value_type_conflict4 *)in_stack_fffffffffffffc78);
      }
    }
    local_d8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffc78);
    local_e0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffc78);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_e8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffc78);
    local_f0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffc78);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    __first_00._M_current = (uchar *)&local_108;
    local_118 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffc78);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffc80,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffc78);
    __last_00._M_current = (uchar *)&local_c8;
    local_120 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffc78);
    local_128 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffc78);
    local_130 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                         insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                   (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcd8,__first_00,
                                    __last_00);
    local_138 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffc78);
    local_140 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffc78);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_158 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffc78);
    local_160 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffc78);
    __first._M_current._7_1_ = in_stack_fffffffffffffc9f;
    __first._M_current._0_7_ = in_stack_fffffffffffffc98;
    local_150 = (uchar *)std::
                         unique<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                   (__first,in_stack_fffffffffffffc90);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffc80,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffc78);
    __last._M_current = (uchar *)&local_108;
    local_170 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffc78);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffc80,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffc78);
    local_178 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                                    in_stack_fffffffffffffca8,__last);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_b0);
    if (((((sVar4 != 0) &&
          (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_c8),
          sVar4 != 0)) &&
         (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_b0),
         sVar4 < 3)) &&
        ((sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_c8),
         sVar4 < 3 &&
         (bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  __last._M_current,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98)),
         !bVar2)))) &&
       (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_108),
       sVar4 < 4)) {
      local_180 = &local_b0;
      local_188._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffc78);
      local_190 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffffc78);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_stack_fffffffffffffc80,
                                (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)in_stack_fffffffffffffc78), bVar2) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_188);
        local_191 = *puVar8;
        local_1a0 = &local_c8;
        local_1a8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffc78);
        local_1b0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        in_stack_fffffffffffffc78);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)in_stack_fffffffffffffc80,
                                  (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)in_stack_fffffffffffffc78), bVar2) {
          puVar8 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_1a8);
          local_1b1 = *puVar8;
          if (local_191 != local_1b1) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11b78e);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11b79b);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11b7a8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11b7b5);
            local_220 = (vector<candidate_variant,_std::allocator<candidate_variant>_> *)0x0;
            while (in_stack_fffffffffffffc90._M_current = (uchar *)local_220,
                  pvVar9 = (vector<candidate_variant,_std::allocator<candidate_variant>_> *)
                           std::vector<t_GSA,_std::allocator<t_GSA>_>::size(local_10),
                  in_stack_fffffffffffffc90._M_current < pvVar9) {
              pvVar5 = std::vector<t_GSA,_std::allocator<t_GSA>_>::operator[]
                                 (local_10,(size_type)local_220);
              local_230._0_4_ = pvVar5->text;
              local_230._4_4_ = pvVar5->suff;
              local_228._0_4_ = pvVar5->lcp;
              local_228._4_1_ = pvVar5->bwt;
              local_228._5_3_ = *(undefined3 *)&pvVar5->field_0xd;
              local_231 = nr_reads1 <= (local_230 & 0xffffffff);
              local_240 = local_230 >> 0x20;
              local_241 = local_228._4_1_;
              local_250 = local_228 & 0xffffffff;
              if ((((ulong)(long)k_left <= local_240) && (local_228._4_1_ == local_191)) &&
                 ((!(bool)local_231 &&
                  (((ulong)(long)k_right <= local_250 &&
                   (sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                      (local_1e8), sVar4 < (ulong)(long)consensus_reads)))))) {
                local_258 = local_230 & 0xffffffff;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (&in_stack_fffffffffffffc80->left_context_idx_0,
                           (value_type_conflict *)in_stack_fffffffffffffc78);
                local_260 = (ulong)(uint)(local_230._4_4_ - k_left);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (&in_stack_fffffffffffffc80->left_context_idx_0,
                           (value_type_conflict *)in_stack_fffffffffffffc78);
              }
              if (((((ulong)(long)k_left <= local_240) && (local_241 == local_1b1)) &&
                  ((local_231 & 1) == 1)) &&
                 (((ulong)(long)k_right <= local_250 &&
                  (sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                     (local_218), sVar4 < (ulong)(long)consensus_reads)))) {
                local_268 = local_230 & 0xffffffff;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (&in_stack_fffffffffffffc80->left_context_idx_0,
                           (value_type_conflict *)in_stack_fffffffffffffc78);
                local_270 = (pointer)(ulong)(uint)(local_230._4_4_ - k_left);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (&in_stack_fffffffffffffc80->left_context_idx_0,
                           (value_type_conflict *)in_stack_fffffffffffffc78);
              }
              local_220 = (vector<candidate_variant,_std::allocator<candidate_variant>_> *)
                          ((long)&(local_220->
                                  super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            }
            sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_1e8);
            if ((sVar4 != 0) &&
               (sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_218),
               sVar4 != 0)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         __first_00._M_current,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         __last_00._M_current);
              in_stack_fffffffffffffc80 = (candidate_variant *)local_2c8;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         __first_00._M_current,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         __last_00._M_current);
              in_stack_fffffffffffffc78 = (value_type *)(local_2c8 + 0x18);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         __first_00._M_current,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         __last_00._M_current);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         __first_00._M_current,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         __last_00._M_current);
              local_280 = local_70;
              local_278 = local_78;
              std::vector<candidate_variant,_std::allocator<candidate_variant>_>::push_back
                        ((vector<candidate_variant,_std::allocator<candidate_variant>_> *)
                         in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
              candidate_variant::~candidate_variant(in_stack_fffffffffffffc80);
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffc90._M_current);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffc90._M_current);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffc90._M_current);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffc90._M_current);
          }
          __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator++(&local_1a8);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&local_188);
      }
    }
    local_11 = 1;
    local_98 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffc90._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffc90._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffc90._M_current);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_stack_fffffffffffffc90._M_current);
  if ((local_11 & 1) == 0) {
    std::vector<candidate_variant,_std::allocator<candidate_variant>_>::~vector
              ((vector<candidate_variant,_std::allocator<candidate_variant>_> *)
               in_stack_fffffffffffffc90._M_current);
  }
  return in_RDI;
}

Assistant:

vector<candidate_variant> find_variants(vector<t_GSA> & gsa_cluster){

	vector<candidate_variant>  out;

	auto counts = vector<vector<unsigned int> >(2,vector<unsigned int>(4,0));

	uint64_t max_lcp_val = 0;//value of max LCP in cluster
	uint64_t max_lcp_read_idx = 0;//index of read with max LCP in cluster
	uint64_t max_lcp_read_pos = 0;//position in read where max LCP starts

	for(uint64_t i=0;i<gsa_cluster.size();++i){

		auto e = gsa_cluster[i];

		//find read with max LCP
		if(e.lcp > max_lcp_val){

			max_lcp_val = e.lcp;
			max_lcp_read_idx = e.text;
			max_lcp_read_pos = e.suff;

		}

		bool sample = e.text < nr_reads1 ? 0 : 1;
		counts[sample?1:0][base_to_int(e.bwt)]++;

	}

	//discard cluster if max LCP is less than k_right
	if(max_lcp_val < k_right) return out;

	//compute the lists of frequent characters in indiv 0 and 1
	vector<unsigned char> frequent_char_0;
	vector<unsigned char> frequent_char_1;

	for(int c=0;c<4;++c){

		if(counts[0][c] >= mcov_out) frequent_char_0.push_back(int_to_base(c));
		if(counts[1][c] >= mcov_out) frequent_char_1.push_back(int_to_base(c));

	}

	std::sort(frequent_char_0.begin(), frequent_char_0.end());
	std::sort(frequent_char_1.begin(), frequent_char_1.end());

	//all variations observed in cluster
	auto all_chars = frequent_char_0;
	all_chars.insert(all_chars.begin(), frequent_char_1.begin(), frequent_char_1.end());
	std::sort( all_chars.begin(), all_chars.end() );
	all_chars.erase(std::unique( all_chars.begin(), all_chars.end() ), all_chars.end());

	//filter: remove clusters that cannot reflect a variation
	if(	frequent_char_0.size()==0 or // not covered enough
		frequent_char_1.size()==0 or // not covered enough
		frequent_char_0.size()>2 or // we require at most 2 alleles per individual
		frequent_char_1.size()>2 or // we require  at most 2 alleles per individual
		frequent_char_0 == frequent_char_1 or // same alleles: probably both heterozigous / multiple region (and no variants)
		all_chars.size() > 3	//4 or more distinct frequent characters in the cluster (probably multiple region)
	){

		return out;

	}

	for(auto c0 : frequent_char_0){

		for(auto c1 : frequent_char_1){

			if(c0 != c1){

				//compute max length of left context in indiv. 0 and 1, on the reads whose left
				//contexts end with c0 and c1, respectively.

				vector<uint64_t> left_pos_0;
				vector<uint64_t> left_idx_0;

				vector<uint64_t> left_pos_1;
				vector<uint64_t> left_idx_1;

				for(uint64_t i=0;i<gsa_cluster.size();++i){

					auto e = gsa_cluster[i];
					bool sample = e.text < nr_reads1 ? 0 : 1;
					uint64_t prefix_len = e.suff;
					unsigned char ch = e.bwt;
					uint64_t lcp = e.lcp;

					if(	prefix_len >= k_left and
						ch == c0 and
						sample == 0 and
						lcp >= k_right and //TODO test
						left_idx_0.size()<consensus_reads){

						left_idx_0.push_back(e.text);
						left_pos_0.push_back(e.suff-k_left);

					}

					if(	prefix_len >= k_left and
						ch == c1 and
						sample == 1 and
						lcp >= k_right and //TODO test
						left_idx_1.size()<consensus_reads){

						left_idx_1.push_back(e.text);
						left_pos_1.push_back(e.suff-k_left);

					}

				}

				if(left_idx_0.size()>0 and left_idx_1.size()>0){

					out.push_back(
						{

							left_idx_0, left_pos_0,
							left_idx_1, left_pos_1,
							max_lcp_read_idx, max_lcp_read_pos

						}
					);

				}

			}

		}

	}

	return out;

}